

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O0

void WebRates(sunrealtype x,sunrealtype y,sunrealtype t,sunrealtype *c,sunrealtype *rate,
             WebData wdata)

{
  int iVar1;
  sunrealtype (*acoef) [6];
  sunrealtype *bcoef;
  sunrealtype fac;
  int ns;
  int j;
  int i;
  WebData wdata_local;
  sunrealtype *rate_local;
  sunrealtype *c_local;
  sunrealtype t_local;
  sunrealtype y_local;
  sunrealtype x_local;
  
  iVar1 = wdata->ns;
  for (i = 0; i < iVar1; i = i + 1) {
    rate[i] = 0.0;
  }
  for (j = 0; j < iVar1; j = j + 1) {
    for (i = 0; i < iVar1; i = i + 1) {
      rate[i] = c[j] * wdata->acoef[i][j] + rate[i];
    }
  }
  for (i = 0; i < iVar1; i = i + 1) {
    rate[i] = c[i] * (wdata->bcoef[i] * (x * 1.0 * y + 1.0) + rate[i]);
  }
  return;
}

Assistant:

static void WebRates(sunrealtype x, sunrealtype y, sunrealtype t,
                     sunrealtype c[], sunrealtype rate[], WebData wdata)
{
  int i, j, ns;
  sunrealtype fac, *bcoef;
  sunrealtype(*acoef)[NS];

  ns    = wdata->ns;
  acoef = wdata->acoef;
  bcoef = wdata->bcoef;

  for (i = 0; i < ns; i++) { rate[i] = ZERO; }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rate[i] += c[j] * acoef[i][j]; }
  }

  fac = ONE + ALPHA * x * y;
  for (i = 0; i < ns; i++) { rate[i] = c[i] * (bcoef[i] * fac + rate[i]); }
}